

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O1

void __thiscall
QGraphicsLinearLayout::setAlignment
          (QGraphicsLinearLayout *this,QGraphicsLayoutItem *item,Alignment alignment)

{
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar1;
  QSizeF *this_00;
  
  this_00 = (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d[1].cachedSizeHints + 1;
  QVar1.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QGraphicsGridLayoutEngine::alignment((QGraphicsGridLayoutEngine *)this_00,item);
  if (QVar1.super_QFlagsStorage<Qt::AlignmentFlag>.i ==
      (QFlagsStorage<Qt::AlignmentFlag>)
      alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i) {
    return;
  }
  QGraphicsGridLayoutEngine::setAlignment((QGraphicsGridLayoutEngine *)this_00,item,alignment);
  (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
  return;
}

Assistant:

void QGraphicsLinearLayout::setAlignment(QGraphicsLayoutItem *item, Qt::Alignment alignment)
{
    Q_D(QGraphicsLinearLayout);
    if (this->alignment(item) == alignment)
        return;
    d->engine.setAlignment(item, alignment);
    invalidate();
}